

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi_custom_type.cpp
# Opt level: O1

void CAPIRegisterCustomType
               (duckdb_connection connection,char *name,duckdb_type duckdb_type,
               duckdb_state expected_outcome)

{
  duckdb_type dVar1;
  duckdb_type dVar2;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000014;
  duckdb_logical_type base_type;
  duckdb_state status;
  AssertionHandler catchAssertionHandler;
  undefined8 local_d8;
  duckdb_type local_d0;
  duckdb_type local_cc;
  SourceLineInfo local_c8;
  AssertionHandler local_b8;
  ITransientExpression local_70;
  duckdb_type *local_60;
  char *local_58;
  size_t sStack_50;
  duckdb_type *local_48;
  StringRef local_40;
  
  local_cc = duckdb_type;
  local_d8 = duckdb_create_logical_type
                       ((ulong)name & 0xffffffff,name,CONCAT44(in_register_00000014,duckdb_type),
                        CONCAT44(in_register_0000000c,expected_outcome));
  duckdb_logical_type_set_alias(local_d8,"NUMBER");
  local_d0 = duckdb_register_logical_type(connection,local_d8,0);
  local_70._vptr_ITransientExpression = (_func_int **)0x4b9018;
  local_70.m_isBinaryExpression = true;
  local_70.m_result = false;
  local_70._10_6_ = 0;
  local_c8.file =
       "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/test/api/capi/capi_custom_type.cpp"
  ;
  local_c8.line = 0xf;
  Catch::StringRef::StringRef(&local_40,"status == expected_outcome");
  Catch::AssertionHandler::AssertionHandler
            (&local_b8,(StringRef *)&local_70,&local_c8,local_40,Normal);
  dVar2 = local_cc;
  dVar1 = local_d0;
  Catch::StringRef::StringRef((StringRef *)&local_c8,"==");
  local_70.m_result = dVar1 == dVar2;
  local_70.m_isBinaryExpression = true;
  local_70._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_005d7c18;
  local_58 = local_c8.file;
  sStack_50 = local_c8.line;
  local_60 = &local_d0;
  local_48 = &local_cc;
  Catch::AssertionHandler::handleExpr(&local_b8,&local_70);
  Catch::ITransientExpression::~ITransientExpression(&local_70);
  Catch::AssertionHandler::complete(&local_b8);
  if (local_b8.m_completed == false) {
    (*(local_b8.m_resultCapture)->_vptr_IResultCapture[0x11])();
  }
  duckdb_destroy_logical_type(&local_d8);
  duckdb_destroy_logical_type(&local_d8);
  duckdb_destroy_logical_type(0);
  return;
}

Assistant:

static void CAPIRegisterCustomType(duckdb_connection connection, const char *name, duckdb_type duckdb_type,
                                   duckdb_state expected_outcome) {
	duckdb_state status;

	auto base_type = duckdb_create_logical_type(duckdb_type);
	duckdb_logical_type_set_alias(base_type, name);

	status = duckdb_register_logical_type(connection, base_type, nullptr);
	REQUIRE(status == expected_outcome);

	duckdb_destroy_logical_type(&base_type);
	duckdb_destroy_logical_type(&base_type);
	duckdb_destroy_logical_type(nullptr);
}